

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::find(map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
       *this,char_range key)

{
  uint64_t pos;
  ulong uVar1;
  value_type *pvVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  pair<const_int_*,_unsigned_long> pVar6;
  char_range local_40;
  
  local_40.end = key.end;
  local_40.begin = key.begin;
  if (local_40.begin == local_40.end) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00183a50;
    pcVar4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:76:key must be a non-empty string."
    ;
  }
  else {
    if (local_40.end[-1] == 0) {
      if ((this->is_ready_ == true) && ((this->hash_trie_).size_ != 0)) {
        pos = 0;
        do {
          pVar6 = compact_bonsai_nlm<int,_16UL>::compare(&this->label_store_,pos,&local_40);
          uVar5 = pVar6.second;
          if (pVar6.first != (value_type *)0x0) {
            return pVar6.first;
          }
          local_40.begin = local_40.begin + uVar5;
          if (this->lambda_ <= uVar5) {
            do {
              pos = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                    ::find_child(&this->hash_trie_,pos,0xff);
              if (pos == 0xffffffffffffffff) goto LAB_001622da;
              uVar5 = uVar5 - this->lambda_;
            } while (this->lambda_ <= uVar5);
          }
          uVar1 = (ulong)(this->codes_)._M_elems[*local_40.begin];
          if ((uVar1 == 0xff) ||
             (pos = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                    ::find_child(&this->hash_trie_,pos,uVar5 << 8 | uVar1),
             pos == 0xffffffffffffffff)) goto LAB_001622da;
          local_40.begin = local_40.begin + 1;
        } while (local_40.begin != local_40.end);
        pVar6 = compact_bonsai_nlm<int,_16UL>::compare(&this->label_store_,pos,&local_40);
        pvVar2 = pVar6.first;
      }
      else {
LAB_001622da:
        pvVar2 = (value_type *)0x0;
      }
      return pvVar2;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00183a50;
    pcVar4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:77:The last character of key must be the null terminator."
    ;
  }
  puVar3[1] = pcVar4;
  __cxa_throw(puVar3,&exception::typeinfo,std::exception::~exception);
}

Assistant:

const value_type* find(char_range key) const {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (!is_ready_ or hash_trie_.size() == 0) {
            return nullptr;
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return vptr;
            }

            key.begin += match;

            while (lambda_ <= match) {
                node_id = hash_trie_.find_child(node_id, step_symb);
                if (node_id == nil_id) {
                    return nullptr;
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Detecting an useless character
                return nullptr;
            }

            node_id = hash_trie_.find_child(node_id, make_symb_(*key.begin, match));
            if (node_id == nil_id) {
                return nullptr;
            }

            ++key.begin;
        }

        return label_store_.compare(node_id, key).first;
    }